

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

WeightParams * __thiscall
CoreML::Specification::Convolution3DLayerParams::mutable_bias(Convolution3DLayerParams *this)

{
  WeightParams *this_00;
  Convolution3DLayerParams *this_local;
  
  if (this->bias_ == (WeightParams *)0x0) {
    this_00 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(this_00);
    this->bias_ = this_00;
  }
  return this->bias_;
}

Assistant:

inline ::CoreML::Specification::WeightParams* Convolution3DLayerParams::mutable_bias() {
  
  if (bias_ == NULL) {
    bias_ = new ::CoreML::Specification::WeightParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Convolution3DLayerParams.bias)
  return bias_;
}